

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_isPrototypeOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  int64_t iVar2;
  JSRefCountHeader *p;
  JSValueUnion JVar3;
  JSValue JVar4;
  JSValue obj;
  
  iVar2 = 1;
  if ((int)argv->tag == -1) {
    JVar3 = (JSValueUnion)(argv->u).ptr;
    obj.tag = argv->tag;
    obj.u.ptr = JVar3.ptr;
    JVar4 = JS_ToObject(ctx,this_val);
    if ((int)JVar4.tag == 6) {
      JVar3.float64 = 0.0;
      iVar2 = 6;
    }
    else {
      *(int *)JVar3.ptr = *JVar3.ptr + 1;
      do {
        obj = JS_GetPrototypeFree(ctx,obj);
        if ((obj.tag & 0xffffffffU) == 6) break;
        if (((int)obj.tag == 2) || (JVar4.u.ptr == obj.u.ptr)) {
          JVar3._1_7_ = 0;
          JVar3.int32._0_1_ = (int)obj.tag != 2;
          JS_FreeValue(ctx,obj);
          JS_FreeValue(ctx,JVar4);
          goto LAB_00152440;
        }
        iVar1 = js_poll_interrupts(ctx);
      } while (iVar1 == 0);
      JS_FreeValue(ctx,obj);
      JS_FreeValue(ctx,JVar4);
      JVar3.float64 = 0.0;
      iVar2 = 6;
    }
  }
  else {
    JVar3.float64 = 0.0;
  }
LAB_00152440:
  JVar4.tag = iVar2;
  JVar4.u.float64 = JVar3.float64;
  return JVar4;
}

Assistant:

static JSValue js_object_isPrototypeOf(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValue obj, v1;
    JSValueConst v;
    int res;

    v = argv[0];
    if (!JS_IsObject(v))
        return JS_FALSE;
    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    v1 = JS_DupValue(ctx, v);
    for(;;) {
        v1 = JS_GetPrototypeFree(ctx, v1);
        if (JS_IsException(v1))
            goto exception;
        if (JS_IsNull(v1)) {
            res = FALSE;
            break;
        }
        if (JS_VALUE_GET_OBJ(obj) == JS_VALUE_GET_OBJ(v1)) {
            res = TRUE;
            break;
        }
        /* avoid infinite loop (possible with proxies) */
        if (js_poll_interrupts(ctx))
            goto exception;
    }
    JS_FreeValue(ctx, v1);
    JS_FreeValue(ctx, obj);
    return JS_NewBool(ctx, res);

exception:
    JS_FreeValue(ctx, v1);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}